

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_body.hpp
# Opt level: O3

string * __thiscall
iutest::WithParamInterface<TestEnum>::MakeTestParamName_abi_cxx11_
          (string *__return_storage_ptr__,WithParamInterface<TestEnum> *this,TestParamInfoType *info
          )

{
  iu_global_format_stringstream strm;
  undefined1 auStack_198 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)auStack_198);
  std::ostream::_M_insert<unsigned_long>((ulong)(auStack_198 + 0x10));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)auStack_198);
  std::ios_base::~ios_base((ios_base *)(auStack_198 + 0x80));
  return __return_storage_ptr__;
}

Assistant:

static const ::std::string MakeTestParamName(const TestParamInfoType& info)
    {
        return detail::MakeIndexName(info.index);
    }